

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

int preprocessor_if(dmr_C *C,stream *stream,token *token,int true_value)

{
  int iVar1;
  
  token->pos = (position)
               ((((ulong)token->pos & 0xffffffffffffffc0) - (ulong)(C->false_nesting == 0)) + 0x1c);
  free_preprocessor_line(C,token->next);
  token->next = stream->top_if;
  stream->top_if = token;
  iVar1 = C->false_nesting;
  if (true_value != 1 || iVar1 != 0) {
    iVar1 = iVar1 + 1;
    C->false_nesting = iVar1;
  }
  return iVar1;
}

Assistant:

static int preprocessor_if(struct dmr_C *C, struct stream *stream, struct token *token, int true_value)
{
	dmrC_token_type(token) = C->false_nesting ? TOKEN_SKIP_GROUPS : TOKEN_IF;
	free_preprocessor_line(C, token->next);
	token->next = stream->top_if;
	stream->top_if = token;
	if (C->false_nesting || true_value != 1)
		C->false_nesting++;
	return 0;
}